

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_node_container_free(lysf_ctx *ctx,lysc_node_container *node)

{
  lysc_node *plVar1;
  lysc_ext_instance *local_68;
  lysc_when *local_58;
  lysc_ext_instance *local_38;
  uint64_t c___1;
  uint64_t c__;
  lysc_node *child_next;
  lysc_node *child;
  lysc_node_container *node_local;
  lysf_ctx *ctx_local;
  
  child_next = node->child;
  while (child_next != (lysc_node *)0x0) {
    plVar1 = child_next->next;
    lysc_node_free_(ctx,child_next);
    child_next = plVar1;
  }
  child_next = (lysc_node *)node->actions;
  while (child_next != (lysc_node *)0x0) {
    plVar1 = child_next->next;
    lysc_node_free_(ctx,child_next);
    child_next = plVar1;
  }
  child_next = (lysc_node *)node->notifs;
  while (child_next != (lysc_node *)0x0) {
    plVar1 = child_next->next;
    lysc_node_free_(ctx,child_next);
    child_next = plVar1;
  }
  c___1 = 0;
  while( true ) {
    if (node->when == (lysc_when **)0x0) {
      local_58 = (lysc_when *)0x0;
    }
    else {
      local_58 = node->when[-1];
    }
    if (local_58 <= c___1) break;
    lysc_when_free(ctx,node->when + c___1);
    c___1 = c___1 + 1;
  }
  if (node->when != (lysc_when **)0x0) {
    free(node->when + -1);
  }
  local_38 = (lysc_ext_instance *)0x0;
  while( true ) {
    if (node->musts == (lysc_must *)0x0) {
      local_68 = (lysc_ext_instance *)0x0;
    }
    else {
      local_68 = node->musts[-1].exts;
    }
    if (local_68 <= local_38) break;
    lysc_must_free(ctx,node->musts + (long)local_38);
    local_38 = (lysc_ext_instance *)((long)&local_38->def + 1);
  }
  if (node->musts != (lysc_must *)0x0) {
    free(&node->musts[-1].exts);
  }
  return;
}

Assistant:

void
lysc_node_container_free(struct lysf_ctx *ctx, struct lysc_node_container *node)
{
    struct lysc_node *child, *child_next;

    LY_LIST_FOR_SAFE(node->child, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)node->actions, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)node->notifs, child_next, child) {
        lysc_node_free_(ctx, child);
    }
    FREE_ARRAY(ctx, node->when, lysc_when_free);
    FREE_ARRAY(ctx, node->musts, lysc_must_free);
}